

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void al_get_window_position(ALLEGRO_DISPLAY *display,int *x,int *y)

{
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x80) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x80) + 0xd8) == 0)) {
    *in_RDX = 0xffffffff;
    *in_RSI = 0xffffffff;
  }
  else {
    (**(code **)(*(long *)(in_RDI + 0x80) + 0xd8))(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void al_get_window_position(ALLEGRO_DISPLAY *display, int *x, int *y)
{
   ASSERT(x);
   ASSERT(y);

   if (display && display->vt && display->vt->get_window_position) {
      display->vt->get_window_position(display, x, y);
   }
   else {
      *x = *y = -1;
   }
}